

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool test2(void)

{
  int *piVar1;
  ostream *poVar2;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> v;
  Queue q;
  allocator_type local_51;
  vector<int,_std::allocator<int>_> local_50;
  queue<int> local_38;
  
  local_38.mData = (int *)0x200000001;
  local_38.mCap = 0x400000003;
  local_38.mSize._0_4_ = 5;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_38;
  std::vector<int,_std::allocator<int>_>::vector(&local_50,__l,&local_51);
  CP::queue<int>::queue
            (&local_38,
             (iterator)
             (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start + 1),
             (iterator)
             (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start + 4));
  while (CONCAT44(local_38.mSize._4_4_,(undefined4)local_38.mSize) != 0) {
    piVar1 = CP::queue<int>::front(&local_38);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    CP::queue<int>::pop(&local_38);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  if (local_38.mData != (int *)0x0) {
    operator_delete__(local_38.mData);
  }
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool test2() {
  vector<int> v = {1, 2, 3, 4, 5};
  Queue q(v.begin() + 1,v.begin() + 4);
  while (!q.empty()) {
    cout << q.front() << " ";
    q.pop();
  }
  cout << endl;
  return true;
}